

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMParentNode::DOMParentNode
          (DOMParentNode *this,DOMNode *containingNode,DOMParentNode *other)

{
  DOMException *this_00;
  DOMNode *pDVar1;
  
  this->_vptr_DOMParentNode = (_func_int **)&PTR_appendChildFast_00411c98;
  this->fContainingNode = containingNode;
  DOMNodeListImpl::DOMNodeListImpl(&this->fChildNodeList,this);
  if (this->fContainingNode != (DOMNode *)0x0) {
    this->fOwnerDocument = other->fOwnerDocument;
    this->fFirstChild = (DOMNode *)0x0;
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fOwnerDocument == (DOMDocument *)0x0) {
    pDVar1 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar1 = &this->fOwnerDocument[10].super_DOMNode;
  }
  DOMException::DOMException(this_00,0xb,0,(MemoryManager *)pDVar1->_vptr_DOMNode);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMParentNode::DOMParentNode(DOMNode* containingNode, const DOMParentNode &other)  :
    fContainingNode(containingNode), fChildNodeList(this)
{
    if (!fContainingNode) {
        throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeMemoryManager);
    }

    this->fOwnerDocument = other.fOwnerDocument;

    // Need to break the association w/ original kids
    this->fFirstChild = 0;
}